

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawTiltedSpanPalCommand::CalcTiltedLighting
          (DrawTiltedSpanPalCommand *this,double lval,double lend,int width,DrawerThread *thread)

{
  uint8_t *puVar1;
  fixed_t fVar2;
  int iVar3;
  int32_t iVar4;
  double dVar5;
  double dVar6;
  uint8_t *clight;
  uint8_t *puStack_48;
  int i;
  uint8_t *lightfiller;
  double lstep;
  uint8_t **tiltlighting;
  DrawerThread *thread_local;
  double dStack_20;
  int width_local;
  double lend_local;
  double lval_local;
  DrawTiltedSpanPalCommand *this_local;
  
  clight._4_4_ = 0;
  thread_local._4_4_ = width;
  if (width != 0) {
    if ((lval != lend) || (NAN(lval) || NAN(lend))) {
      dVar5 = (lend - lval) / (double)width;
      lend_local = lval;
      if (24.0 <= lval) {
        puVar1 = this->basecolormapdata;
        iVar3 = this->planeshade;
        dVar6 = MIN<double>(24.0,lval);
        fVar2 = FloatToFixed(dVar6);
        iVar3 = clamp<int>(iVar3 - fVar2 >> 0x10,0,0x1f);
        puStack_48 = puVar1 + (iVar3 << 8);
        for (; clight._4_4_ <= width && 24.0 <= lend_local; clight._4_4_ = clight._4_4_ + 1) {
          thread->tiltlighting[clight._4_4_] = puStack_48;
          lend_local = dVar5 + lend_local;
        }
      }
      dStack_20 = lend;
      if (24.0 <= lend) {
        puVar1 = this->basecolormapdata;
        iVar3 = this->planeshade;
        dVar6 = MIN<double>(24.0,lend);
        fVar2 = FloatToFixed(dVar6);
        iVar3 = clamp<int>(iVar3 - fVar2 >> 0x10,0,0x1f);
        puStack_48 = puVar1 + (iVar3 << 8);
        for (; clight._4_4_ < thread_local._4_4_ && 24.0 <= dStack_20;
            thread_local._4_4_ = thread_local._4_4_ + -1) {
          thread->tiltlighting[thread_local._4_4_] = puStack_48;
          dStack_20 = dStack_20 - dVar5;
        }
      }
      if (0 < thread_local._4_4_) {
        dVar5 = FixedToFloat(this->planeshade);
        lend_local = dVar5 - lend_local;
        dVar5 = FixedToFloat(this->planeshade);
        dVar5 = ((dVar5 - dStack_20) - lend_local) / (double)thread_local._4_4_;
        if (0.0 <= dVar5) {
          if (lend_local < 31.0) {
            for (; lend_local < 0.0 && clight._4_4_ <= thread_local._4_4_;
                lend_local = dVar5 + lend_local) {
              thread->tiltlighting[clight._4_4_] = this->basecolormapdata;
              clight._4_4_ = clight._4_4_ + 1;
            }
            if (thread_local._4_4_ < clight._4_4_) {
              return;
            }
            for (; clight._4_4_ <= thread_local._4_4_ && lend_local < 31.0;
                lend_local = dVar5 + lend_local) {
              puVar1 = this->basecolormapdata;
              iVar4 = xs_ToInt((real64)lend_local,-0.499999985);
              thread->tiltlighting[clight._4_4_] = puVar1 + (iVar4 << 8);
              clight._4_4_ = clight._4_4_ + 1;
            }
            puVar1 = this->basecolormapdata;
          }
          else {
            puVar1 = this->basecolormapdata;
          }
          puStack_48 = puVar1 + 0x1f00;
        }
        else if (1.0 <= lend_local) {
          if (32.0 <= lend_local) {
            puVar1 = this->basecolormapdata;
            for (; 32.0 <= lend_local && clight._4_4_ <= thread_local._4_4_;
                lend_local = dVar5 + lend_local) {
              thread->tiltlighting[clight._4_4_] = puVar1 + 0x1f00;
              clight._4_4_ = clight._4_4_ + 1;
            }
            if (thread_local._4_4_ < clight._4_4_) {
              return;
            }
          }
          for (; clight._4_4_ <= thread_local._4_4_ && 0.0 <= lend_local;
              lend_local = dVar5 + lend_local) {
            puVar1 = this->basecolormapdata;
            iVar4 = xs_ToInt((real64)lend_local,-0.499999985);
            thread->tiltlighting[clight._4_4_] = puVar1 + (iVar4 << 8);
            clight._4_4_ = clight._4_4_ + 1;
          }
          puStack_48 = this->basecolormapdata;
        }
        else {
          puStack_48 = this->basecolormapdata;
        }
      }
      goto LAB_0036df11;
    }
  }
  puVar1 = this->basecolormapdata;
  iVar3 = this->planeshade;
  dVar5 = MIN<double>(24.0,lval);
  fVar2 = FloatToFixed(dVar5);
  iVar3 = clamp<int>(iVar3 - fVar2 >> 0x10,0,0x1f);
  puStack_48 = puVar1 + (iVar3 << 8);
LAB_0036df11:
  for (; clight._4_4_ <= thread_local._4_4_; clight._4_4_ = clight._4_4_ + 1) {
    thread->tiltlighting[clight._4_4_] = puStack_48;
  }
  return;
}

Assistant:

void DrawTiltedSpanPalCommand::CalcTiltedLighting(double lval, double lend, int width, DrawerThread *thread)
	{
		const uint8_t **tiltlighting = thread->tiltlighting;

		double lstep;
		uint8_t *lightfiller;
		int i = 0;

		if (width == 0 || lval == lend)
		{ // Constant lighting
			lightfiller = basecolormapdata + (GETPALOOKUP(lval, planeshade) << COLORMAPSHIFT);
		}
		else
		{
			lstep = (lend - lval) / width;
			if (lval >= MAXLIGHTVIS)
			{ // lval starts "too bright".
				lightfiller = basecolormapdata + (GETPALOOKUP(lval, planeshade) << COLORMAPSHIFT);
				for (; i <= width && lval >= MAXLIGHTVIS; ++i)
				{
					tiltlighting[i] = lightfiller;
					lval += lstep;
				}
			}
			if (lend >= MAXLIGHTVIS)
			{ // lend ends "too bright".
				lightfiller = basecolormapdata + (GETPALOOKUP(lend, planeshade) << COLORMAPSHIFT);
				for (; width > i && lend >= MAXLIGHTVIS; --width)
				{
					tiltlighting[width] = lightfiller;
					lend -= lstep;
				}
			}
			if (width > 0)
			{
				lval = FIXED2DBL(planeshade) - lval;
				lend = FIXED2DBL(planeshade) - lend;
				lstep = (lend - lval) / width;
				if (lstep < 0)
				{ // Going from dark to light
					if (lval < 1.)
					{ // All bright
						lightfiller = basecolormapdata;
					}
					else
					{
						if (lval >= NUMCOLORMAPS)
						{ // Starts beyond the dark end
							uint8_t *clight = basecolormapdata + ((NUMCOLORMAPS - 1) << COLORMAPSHIFT);
							while (lval >= NUMCOLORMAPS && i <= width)
							{
								tiltlighting[i++] = clight;
								lval += lstep;
							}
							if (i > width)
								return;
						}
						while (i <= width && lval >= 0)
						{
							tiltlighting[i++] = basecolormapdata + (xs_ToInt(lval) << COLORMAPSHIFT);
							lval += lstep;
						}
						lightfiller = basecolormapdata;
					}
				}
				else
				{ // Going from light to dark
					if (lval >= (NUMCOLORMAPS - 1))
					{ // All dark
						lightfiller = basecolormapdata + ((NUMCOLORMAPS - 1) << COLORMAPSHIFT);
					}
					else
					{
						while (lval < 0 && i <= width)
						{
							tiltlighting[i++] = basecolormapdata;
							lval += lstep;
						}
						if (i > width)
							return;
						while (i <= width && lval < (NUMCOLORMAPS - 1))
						{
							tiltlighting[i++] = basecolormapdata + (xs_ToInt(lval) << COLORMAPSHIFT);
							lval += lstep;
						}
						lightfiller = basecolormapdata + ((NUMCOLORMAPS - 1) << COLORMAPSHIFT);
					}
				}
			}
		}
		for (; i <= width; i++)
		{
			tiltlighting[i] = lightfiller;
		}
	}